

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O3

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,unsigned_int>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,uint *args_1)

{
  uint uVar1;
  sha512_half_hasher h;
  uint local_fc;
  SHA512_CTX local_f8;
  
  SHA512_Init(&local_f8);
  local_fc = CONCAT22(local_fc._2_2_,*(ushort *)this << 8 | *(ushort *)this >> 8);
  SHA512_Update(&local_f8,&local_fc,2);
  uVar1 = *(uint *)args;
  local_fc = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SHA512_Update(&local_f8,&local_fc,4);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}